

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_token.c
# Opt level: O2

simple_token * simple_token_new_parent(simple_token *child,unsigned_short type)

{
  simple_token *psVar1;
  simple_token *psVar2;
  
  if (child != (simple_token *)0x0) {
    psVar1 = simple_token_new(type,child->start,0);
    psVar1->child = child;
    child->prev = (simple_token *)0x0;
    if (child->next == (simple_token *)0x0) {
      psVar1->len = child->len;
    }
    else {
      do {
        psVar2 = child;
        child = psVar2->next;
      } while (psVar2->next != (simple_token *)0x0);
      psVar1->len = (psVar2->len + psVar2->start) - psVar1->start;
    }
    return psVar1;
  }
  psVar1 = simple_token_new(type,0,0);
  return psVar1;
}

Assistant:

simple_token * simple_token_new_parent(simple_token * child, unsigned short type) {
	if (child == NULL) {
		return simple_token_new(type, 0, 0);
	}

	simple_token * t = simple_token_new(type, child->start, 0);
	t->child = child;
	child->prev = NULL;

	// Ensure that parent length correctly includes children
	if (child == NULL) {
		t->len = 0;
	} else if (child->next == NULL) {
		t->len = child->len;
	} else {
		while (child->next != NULL) {
			child = child->next;
		}

		t->len = child->start + child->len - t->start;
	}

	return t;
}